

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_node2pfx_record(trie_node *node,pfx_record *records,uint ary_len)

{
  long lVar1;
  uint *puVar2;
  long in_FS_OFFSET;
  uint local_3c;
  uint i;
  node_data *data;
  uint ary_len_local;
  pfx_record *records_local;
  trie_node *node_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (uint *)node->data;
  if (ary_len < *puVar2) {
    node_local._4_4_ = 0xffffffff;
  }
  else {
    for (local_3c = 0; local_3c < *puVar2; local_3c = local_3c + 1) {
      records[local_3c].asn = *(uint32_t *)(*(long *)(puVar2 + 2) + (ulong)local_3c * 0x10);
      *(undefined8 *)&records[local_3c].prefix = *(undefined8 *)&node->prefix;
      *(undefined8 *)((long)&records[local_3c].prefix.u + 4) =
           *(undefined8 *)((long)&(node->prefix).u + 4);
      records[local_3c].prefix.u.addr6.addr[3] = (node->prefix).u.addr6.addr[3];
      records[local_3c].min_len = node->len;
      records[local_3c].max_len = *(uint8_t *)(*(long *)(puVar2 + 2) + (ulong)local_3c * 0x10 + 4);
      records[local_3c].socket =
           *(rtr_socket **)(*(long *)(puVar2 + 2) + (ulong)local_3c * 0x10 + 8);
    }
    node_local._4_4_ = *puVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_node2pfx_record(struct trie_node *node, struct pfx_record *records, const unsigned int ary_len)
{
	struct node_data *data = node->data;

	if (ary_len < data->len)
		return PFX_ERROR;

	for (unsigned int i = 0; i < data->len; i++) {
		records[i].asn = data->ary[i].asn;
		records[i].prefix = node->prefix;
		records[i].min_len = node->len;
		records[i].max_len = data->ary[i].max_len;
		records[i].socket = data->ary[i].socket;
	}
	return data->len;
}